

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalGenerator::IndexMakefile(cmGlobalGenerator *this,cmMakefile *mf)

{
  char *pcVar1;
  __hashtable *__h;
  allocator local_41;
  long *local_40 [2];
  long local_30 [2];
  cmMakefile *local_20;
  
  pcVar1 = cmMakefile::GetCurrentSourceDirectory(mf);
  std::__cxx11::string::string((string *)local_40,pcVar1,&local_41);
  local_20 = mf;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmMakefile*>,std::allocator<std::pair<std::__cxx11::string_const,cmMakefile*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,cmMakefile*>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmMakefile*>,std::allocator<std::pair<std::__cxx11::string_const,cmMakefile*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->MakefileSearchIndex,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::IndexMakefile(cmMakefile* mf)
{
  // FIXME: add_subdirectory supports multiple build directories
  // sharing the same source directory.  We currently index only the
  // first one, because that is what FindMakefile has always returned.
  // All of its callers will need to be modified to support looking
  // up directories by build directory path.
  this->MakefileSearchIndex.insert(
    MakefileMap::value_type(mf->GetCurrentSourceDirectory(), mf));
}